

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O1

void __thiscall Clone_variableInModel_Test::TestBody(Clone_variableInModel_Test *this)

{
  char cVar1;
  char *pcVar2;
  shared_ptr<libcellml::ParentedEntity> *in_R9;
  AssertionResult gtest_ar;
  VariablePtr vClone;
  VariablePtr v;
  ComponentPtr c;
  UnitsPtr u;
  ModelPtr m;
  long *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  shared_ptr<libcellml::Units> local_98;
  undefined1 local_88 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  shared_ptr *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  shared_ptr *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long local_48 [2];
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  shared_ptr *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  char local_18 [8];
  
  libcellml::Model::create();
  libcellml::Units::create();
  local_58 = (shared_ptr *)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"daves","");
  libcellml::NamedEntity::setName(local_38);
  if (local_58 != (shared_ptr *)local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  libcellml::Model::addUnits(local_28);
  libcellml::Component::create();
  libcellml::ComponentEntity::addComponent(local_28);
  libcellml::Variable::create();
  libcellml::Variable::setUnits(local_68);
  libcellml::Component::addVariable(local_58);
  libcellml::Variable::clone();
  local_98.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  libcellml::ParentedEntity::parent();
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::ParentedEntity>>
            ((AssertionResult *)local_88,(internal *)"nullptr","vClone->parent()",(char *)&local_98,
             &local_a8,in_R9);
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_88[0] == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_88._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_88._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_a8 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::units();
  libcellml::Variable::units();
  testing::internal::
  CmpHelperNE<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)local_88,(internal *)"v->units()","vClone->units()",
             (char *)&local_a8,&local_98,(shared_ptr<libcellml::Units> *)in_R9);
  if (local_98.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_88[0] == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_88._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_88._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_a8 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  libcellml::Variable::units();
  libcellml::ParentedEntity::parent();
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::ParentedEntity>>
            ((AssertionResult *)local_88,(internal *)"nullptr","vClone->units()->parent()",local_18,
             &local_a8,in_R9);
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_98.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_88[0] == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_88._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_88._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_a8 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
      local_a8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Clone, variableInModel)
{
    auto m = libcellml::Model::create();
    auto u = libcellml::Units::create();
    u->setName("daves");
    m->addUnits(u);

    auto c = libcellml::Component::create();
    m->addComponent(c);

    auto v = libcellml::Variable::create();
    v->setUnits(u);

    c->addVariable(v);

    auto vClone = v->clone();

    EXPECT_EQ(nullptr, vClone->parent());
    EXPECT_NE(v->units(), vClone->units());
    EXPECT_EQ(nullptr, vClone->units()->parent());
}